

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O3

void learn(ect *e,single_learner *base,example *ec)

{
  float fVar1;
  uint32_t uVar2;
  float fVar3;
  
  uVar2 = (ec->l).multi.label;
  fVar1 = (ec->l).simple.weight;
  predict(e,base,ec);
  fVar3 = (ec->pred).scalar;
  if (uVar2 != 0xffffffff) {
    ect_train(e,base,ec);
  }
  (ec->l).multi.label = uVar2;
  (ec->l).simple.weight = fVar1;
  (ec->pred).scalar = fVar3;
  return;
}

Assistant:

void learn(ect& e, single_learner& base, example& ec)
{
  MULTICLASS::label_t mc = ec.l.multi;
  predict(e, base, ec);
  uint32_t pred = ec.pred.multiclass;

  if (mc.label != (uint32_t)-1)
    ect_train(e, base, ec);
  ec.l.multi = mc;
  ec.pred.multiclass = pred;
}